

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

SurfaceInteraction * __thiscall
pbrt::Transform::ApplyInverse
          (SurfaceInteraction *__return_storage_ptr__,Transform *this,SurfaceInteraction *si)

{
  undefined8 uVar1;
  ulong uVar2;
  Point3fi *pPVar3;
  Float FVar4;
  undefined1 auVar5 [60];
  undefined1 auVar6 [64];
  undefined1 auVar23 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  Normal3<float> NVar24;
  Vector3<float> VVar25;
  Transform t;
  Tuple3<pbrt::Normal3,_float> local_c8;
  Transform local_b8;
  
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)
   &(__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (__return_storage_ptr__->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x0;
  pPVar3 = &(__return_storage_ptr__->super_Interaction).pi;
  (pPVar3->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = 0.0;
  (pPVar3->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = 0.0;
  pPVar3 = &(__return_storage_ptr__->super_Interaction).pi;
  (pPVar3->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = 0.0;
  (pPVar3->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = 0.0;
  pPVar3 = &(__return_storage_ptr__->super_Interaction).pi;
  (pPVar3->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = 0.0;
  (pPVar3->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = 0.0;
  (__return_storage_ptr__->super_Interaction).time = 0.0;
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  auVar6 = ZEXT464(0) << 0x40;
  auVar5 = auVar6._0_60_;
  (__return_storage_ptr__->shading).n = (Normal3f)auVar5._0_12_;
  (__return_storage_ptr__->shading).dpdu = (Vector3f)auVar5._12_12_;
  (__return_storage_ptr__->shading).dpdv = (Vector3f)auVar5._24_12_;
  (__return_storage_ptr__->shading).dndu = (Normal3f)auVar5._36_12_;
  (__return_storage_ptr__->shading).dndv = (Normal3f)auVar5._48_12_;
  __return_storage_ptr__->faceIndex = auVar6._60_4_;
  *(undefined1 (*) [64])&(__return_storage_ptr__->super_Interaction).mediumInterface = auVar6;
  *(undefined1 (*) [64])&(__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z
       = auVar6;
  operator()((Point3fi *)__return_storage_ptr__,this,(Point3fi *)si);
  local_b8.m.m[0]._0_8_ = *(undefined8 *)(this->mInv).m[0];
  local_b8.m.m[0]._8_8_ = *(undefined8 *)((this->mInv).m[0] + 2);
  local_b8.m.m[1]._0_8_ = *(undefined8 *)(this->mInv).m[1];
  local_b8.m.m[1]._8_8_ = *(undefined8 *)((this->mInv).m[1] + 2);
  local_b8.m.m[2]._0_8_ = *(undefined8 *)(this->mInv).m[2];
  local_b8.m.m[2]._8_8_ = *(undefined8 *)((this->mInv).m[2] + 2);
  local_b8.m.m[3]._0_8_ = *(undefined8 *)(this->mInv).m[3];
  local_b8.m.m[3]._8_8_ = *(undefined8 *)((this->mInv).m[3] + 2);
  local_b8.mInv.m[0]._0_8_ = *(undefined8 *)(this->m).m[0];
  local_b8.mInv.m[0]._8_8_ = *(undefined8 *)((this->m).m[0] + 2);
  local_b8.mInv.m[1]._0_8_ = *(undefined8 *)(this->m).m[1];
  local_b8.mInv.m[1]._8_8_ = *(undefined8 *)((this->m).m[1] + 2);
  local_b8.mInv.m[2]._0_8_ = *(undefined8 *)(this->m).m[2];
  local_b8.mInv.m[2]._8_8_ = *(undefined8 *)((this->m).m[2] + 2);
  local_b8.mInv.m[3]._0_8_ = *(undefined8 *)(this->m).m[3];
  local_b8.mInv.m[3]._8_8_ = *(undefined8 *)((this->m).m[3] + 2);
  auVar23 = ZEXT856((ulong)local_b8.mInv.m[0]._8_8_);
  NVar24 = operator()(&local_b8,&(si->super_Interaction).n);
  local_c8.z = NVar24.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar6._0_8_ = NVar24.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar6._8_56_ = auVar23;
  local_c8._0_8_ = vmovlps_avx(auVar6._0_16_);
  NVar24 = Normalize<float>((Normal3<float> *)&local_c8);
  auVar7._0_8_ = NVar24.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar7._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar7._0_16_);
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x =
       (float)(int)uVar1;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar24.super_Tuple3<pbrt::Normal3,_float>.z;
  VVar25 = operator()(&local_b8,&(si->super_Interaction).wo);
  local_c8.z = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar23;
  local_c8._0_8_ = vmovlps_avx(auVar8._0_16_);
  VVar25 = Normalize<float>((Vector3<float> *)&local_c8);
  auVar9._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar9._0_16_);
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)uVar1;
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23 = (undefined1  [56])0x0;
  (__return_storage_ptr__->super_Interaction).time = (si->super_Interaction).time;
  (__return_storage_ptr__->super_Interaction).mediumInterface =
       (si->super_Interaction).mediumInterface;
  (__return_storage_ptr__->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float> =
       (si->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>;
  VVar25 = operator()(&local_b8,&si->dpdu);
  auVar10._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar10._0_16_);
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar25 = operator()(&local_b8,&si->dpdv);
  auVar11._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar11._0_16_);
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  NVar24 = operator()(&local_b8,&si->dndu);
  auVar12._0_8_ = NVar24.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar12._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar12._0_16_);
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.z =
       NVar24.super_Tuple3<pbrt::Normal3,_float>.z;
  NVar24 = operator()(&local_b8,&si->dndv);
  auVar13._0_8_ = NVar24.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar13._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar13._0_16_);
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.z =
       NVar24.super_Tuple3<pbrt::Normal3,_float>.z;
  NVar24 = operator()(&local_b8,&(si->shading).n);
  local_c8.z = NVar24.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar14._0_8_ = NVar24.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar14._8_56_ = auVar23;
  local_c8._0_8_ = vmovlps_avx(auVar14._0_16_);
  NVar24 = Normalize<float>((Normal3<float> *)&local_c8);
  auVar15._0_8_ = NVar24.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar15._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar15._0_16_);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar24.super_Tuple3<pbrt::Normal3,_float>.z;
  VVar25 = operator()(&local_b8,&(si->shading).dpdu);
  auVar16._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar16._0_16_);
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar25 = operator()(&local_b8,&(si->shading).dpdv);
  auVar17._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar17._0_16_);
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  NVar24 = operator()(&local_b8,&(si->shading).dndu);
  auVar18._0_8_ = NVar24.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar18._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar18._0_16_);
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar24.super_Tuple3<pbrt::Normal3,_float>.z;
  NVar24 = operator()(&local_b8,&(si->shading).dndv);
  auVar19._0_8_ = NVar24.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar19._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar19._0_16_);
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar24.super_Tuple3<pbrt::Normal3,_float>.z;
  FVar4 = si->dvdx;
  uVar2._0_4_ = si->dudy;
  uVar2._4_4_ = si->dvdy;
  auVar23 = ZEXT856(uVar2);
  __return_storage_ptr__->dudx = si->dudx;
  __return_storage_ptr__->dvdx = FVar4;
  __return_storage_ptr__->dudy = (Float)(undefined4)uVar2;
  __return_storage_ptr__->dvdy = (Float)uVar2._4_4_;
  VVar25 = operator()(&local_b8,&si->dpdx);
  auVar20._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar20._0_16_);
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar25 = operator()(&local_b8,&si->dpdy);
  auVar21._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar21._0_16_);
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar2 = (si->areaLight).
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits;
  auVar23 = ZEXT856(uVar2);
  (__return_storage_ptr__->material).
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = (si->material).
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  (__return_storage_ptr__->areaLight).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = uVar2;
  NVar24 = FaceForward<float>(&(__return_storage_ptr__->shading).n,
                              &(__return_storage_ptr__->super_Interaction).n);
  auVar22._0_8_ = NVar24.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar22._8_56_ = auVar23;
  uVar1 = vmovlps_avx(auVar22._0_16_);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar24.super_Tuple3<pbrt::Normal3,_float>.z;
  __return_storage_ptr__->faceIndex = si->faceIndex;
  return __return_storage_ptr__;
}

Assistant:

SurfaceInteraction Transform::ApplyInverse(const SurfaceInteraction &si) const {
    SurfaceInteraction ret;
    ret.pi = (*this)(si.pi);

    // Transform remaining members of _SurfaceInteraction_
    Transform t = Inverse(*this);
    ret.n = Normalize(t(si.n));
    ret.wo = Normalize(t(si.wo));
    ret.time = si.time;
    ret.mediumInterface = si.mediumInterface;
    ret.uv = si.uv;
    ret.dpdu = t(si.dpdu);
    ret.dpdv = t(si.dpdv);
    ret.dndu = t(si.dndu);
    ret.dndv = t(si.dndv);
    ret.shading.n = Normalize(t(si.shading.n));
    ret.shading.dpdu = t(si.shading.dpdu);
    ret.shading.dpdv = t(si.shading.dpdv);
    ret.shading.dndu = t(si.shading.dndu);
    ret.shading.dndv = t(si.shading.dndv);
    ret.dudx = si.dudx;
    ret.dvdx = si.dvdx;
    ret.dudy = si.dudy;
    ret.dvdy = si.dvdy;
    ret.dpdx = t(si.dpdx);
    ret.dpdy = t(si.dpdy);
    ret.material = si.material;
    ret.areaLight = si.areaLight;
    //    ret.n = FaceForward(ret.n, ret.shading.n);
    ret.shading.n = FaceForward(ret.shading.n, ret.n);
    ret.faceIndex = si.faceIndex;
    return ret;
}